

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint addChunk_tIME(ucvector *out,LodePNGTime *time)

{
  undefined1 *puVar1;
  uchar *in_RSI;
  char *in_RDI;
  uchar *data;
  uint error;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 uVar2;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  uint uVar3;
  
  uVar2 = 0;
  puVar1 = (undefined1 *)lodepng_malloc(0x10dd00);
  if (puVar1 == (undefined1 *)0x0) {
    uVar3 = 0x53;
  }
  else {
    *puVar1 = (char)((uint)*(undefined4 *)in_RSI >> 8);
    puVar1[1] = (char)*(undefined4 *)in_RSI;
    puVar1[2] = (char)*(undefined4 *)(in_RSI + 4);
    puVar1[3] = (char)*(undefined4 *)(in_RSI + 8);
    puVar1[4] = (char)*(undefined4 *)(in_RSI + 0xc);
    puVar1[5] = (char)*(undefined4 *)(in_RSI + 0x10);
    puVar1[6] = (char)*(undefined4 *)(in_RSI + 0x14);
    uVar3 = addChunk((ucvector *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                     in_RDI,in_RSI,CONCAT44(uVar2,in_stack_ffffffffffffffe0));
    lodepng_free((void *)0x10ddbb);
  }
  return uVar3;
}

Assistant:

static unsigned addChunk_tIME(ucvector* out, const LodePNGTime* time)
{
  unsigned error = 0;
  unsigned char* data = (unsigned char*)lodepng_malloc(7);
  if(!data) return 83; /*alloc fail*/
  data[0] = (unsigned char)(time->year >> 8);
  data[1] = (unsigned char)(time->year & 255);
  data[2] = (unsigned char)time->month;
  data[3] = (unsigned char)time->day;
  data[4] = (unsigned char)time->hour;
  data[5] = (unsigned char)time->minute;
  data[6] = (unsigned char)time->second;
  error = addChunk(out, "tIME", data, 7);
  lodepng_free(data);
  return error;
}